

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPCInstPrinter.c
# Opt level: O1

void PPC_printInst(MCInst *MI,SStream *O,void *Info)

{
  char *pcVar1;
  char *pcVar2;
  uint8_t *puVar3;
  byte bVar4;
  char cVar5;
  ushort uVar6;
  cs_detail *pcVar7;
  bool bVar8;
  bool bVar9;
  _Bool _Var10;
  uint uVar11;
  uint uVar12;
  arm64_cc aVar13;
  MCOperand *pMVar14;
  ulong uVar15;
  int64_t iVar16;
  int64_t iVar17;
  MCRegisterClass *pMVar18;
  size_t sVar19;
  cs_struct *pcVar20;
  uint *Modifier;
  SStream *O_00;
  uint OpNo;
  int v;
  char *pcVar21;
  char *pcVar22;
  ppc_alias alias;
  ulong local_240;
  SStream local_238;
  
  uVar11 = MCInst_getOpcode(MI);
  if (uVar11 == 0x3d2) {
    pMVar14 = MCInst_getOperand(MI,2);
    local_240 = MCOperand_getImm(pMVar14);
    pMVar14 = MCInst_getOperand(MI,3);
    uVar15 = MCOperand_getImm(pMVar14);
    pMVar14 = MCInst_getOperand(MI,4);
    iVar16 = MCOperand_getImm(pMVar14);
    uVar11 = (uint)local_240 & 0xff;
    if (((uVar15 & 0xff) == 0 && uVar11 < 0x20) && (((uint)iVar16 & 0xff) == 0x1f - uVar11)) {
      SStream_concat0(O,"slwi\t");
      MCInst_setOpcodePub(MI,0x3a5);
      bVar9 = true;
    }
    else {
      bVar9 = false;
    }
    if ((uVar11 < 0x20) && ((char)iVar16 == '\x1f' && ((uint)uVar15 & 0xff) == 0x20 - uVar11)) {
      SStream_concat0(O,"srwi\t");
      MCInst_setOpcodePub(MI,0x3a6);
      bVar9 = true;
      local_240 = (ulong)(0x20 - uVar11);
    }
    if (bVar9) {
      printOperand(MI,0,O);
      SStream_concat0(O,", ");
      printOperand(MI,1,O);
      pcVar21 = ", %u";
      if (9 < (byte)local_240) {
        pcVar21 = ", 0x%x";
      }
      SStream_concat(O,pcVar21,local_240 & 0xff);
      if (MI->csh->detail == CS_OPT_OFF) {
        return;
      }
      pcVar7 = MI->flat_insn->detail;
      bVar4 = (pcVar7->field_6).x86.addr_size;
      puVar3 = pcVar7->groups + (ulong)bVar4 * 0x18 + 0x1d;
      puVar3[0] = '\x02';
      puVar3[1] = '\0';
      puVar3[2] = '\0';
      puVar3[3] = '\0';
      *(ulong *)(pcVar7->groups + (ulong)bVar4 * 0x18 + 0x25) = local_240 & 0xff;
      (pcVar7->field_6).x86.addr_size = bVar4 + 1;
      return;
    }
  }
  uVar11 = MCInst_getOpcode(MI);
  if ((uVar11 == 0x302) || (uVar11 = MCInst_getOpcode(MI), uVar11 == 0x303)) {
    pMVar14 = MCInst_getOperand(MI,1);
    uVar11 = MCOperand_getReg(pMVar14);
    pMVar14 = MCInst_getOperand(MI,2);
    uVar12 = MCOperand_getReg(pMVar14);
    if (uVar11 == uVar12) {
      SStream_concat0(O,"mr\t");
      MCInst_setOpcodePub(MI,0x3f0);
      printOperand(MI,0,O);
      SStream_concat0(O,", ");
      printOperand(MI,1,O);
      return;
    }
  }
  uVar11 = MCInst_getOpcode(MI);
  if (uVar11 == 0x3c9) {
    pMVar14 = MCInst_getOperand(MI,2);
    iVar16 = MCOperand_getImm(pMVar14);
    pMVar14 = MCInst_getOperand(MI,3);
    iVar17 = MCOperand_getImm(pMVar14);
    uVar11 = (uint)iVar16 & 0xff;
    if (0x3f - uVar11 == ((uint)iVar17 & 0xff)) {
      SStream_concat0(O,"sldi\t");
      MCInst_setOpcodePub(MI,0x3a7);
      printOperand(MI,0,O);
      SStream_concat0(O,", ");
      printOperand(MI,1,O);
      if (uVar11 < 10) {
        pcVar21 = ", %u";
      }
      else {
        pcVar21 = ", 0x%x";
      }
      SStream_concat(O,pcVar21,(ulong)uVar11);
      return;
    }
  }
  uVar11 = MCInst_getOpcode(MI);
  if ((((uVar11 == 0x5e6) || (uVar11 = MCInst_getOpcode(MI), uVar11 == 0x5e7)) ||
      (uVar11 = MCInst_getOpcode(MI), uVar11 == 0x5ea)) ||
     (uVar11 = MCInst_getOpcode(MI), uVar11 == 0x5eb)) {
    pMVar14 = MCInst_getOperand(MI,2);
    iVar16 = MCOperand_getImm(pMVar14);
    pMVar14 = MCInst_getOperand(MI,2);
    MCOperand_setImm(pMVar14,(iVar16 << 0x32) >> 0x32);
  }
  uVar11 = MCInst_getOpcode(MI);
  if (0xffffffd7 < uVar11 - 0xc2) {
    pMVar14 = MCInst_getOperand(MI,0);
    _Var10 = MCOperand_isImm(pMVar14);
    if (_Var10) {
      pMVar14 = MCInst_getOperand(MI,0);
      iVar16 = MCOperand_getImm(pMVar14);
      pMVar14 = MCInst_getOperand(MI,0);
      MCOperand_setImm(pMVar14,(iVar16 << 0x32) >> 0x32);
    }
  }
  uVar11 = MCInst_getOpcode(MI);
  if (((uVar11 == 0x78) || (uVar11 = MCInst_getOpcode(MI), uVar11 == 0x79)) ||
     ((uVar11 = MCInst_getOpcode(MI), uVar11 == 0xc2 ||
      (uVar11 = MCInst_getOpcode(MI), uVar11 == 200)))) {
    pMVar14 = MCInst_getOperand(MI,0);
    iVar16 = MCOperand_getImm(pMVar14);
    pMVar14 = MCInst_getOperand(MI,0);
    MCOperand_setImm(pMVar14,(iVar16 << 0x28) >> 0x28);
  }
  SStream_Init(&local_238);
  uVar11 = MCInst_getOpcode(MI);
  pcVar21 = (char *)0x0;
  bVar9 = false;
  if (uVar11 - 0x5e6 < 8) {
    pcVar21 = (&PTR_anon_var_dwarf_3a9737_00656f30)[uVar11 - 0x5e6];
    uVar11 = MCInst_getNumOperands(MI);
    if (uVar11 == 3) {
      bVar9 = false;
      pMVar14 = MCInst_getOperand(MI,0);
      _Var10 = MCOperand_isImm(pMVar14);
      if (_Var10) {
        bVar9 = false;
        pMVar14 = MCInst_getOperand(MI,0);
        iVar16 = MCOperand_getImm(pMVar14);
        if (-1 < iVar16) {
          bVar9 = false;
          pMVar14 = MCInst_getOperand(MI,0);
          iVar16 = MCOperand_getImm(pMVar14);
          if (iVar16 < 2) {
            SStream_concat(&local_238,pcVar21,"dnzf");
            bVar9 = true;
          }
        }
      }
    }
    uVar11 = MCInst_getNumOperands(MI);
    if (uVar11 == 3) {
      pMVar14 = MCInst_getOperand(MI,0);
      _Var10 = MCOperand_isImm(pMVar14);
      if (_Var10) {
        pMVar14 = MCInst_getOperand(MI,0);
        iVar16 = MCOperand_getImm(pMVar14);
        if (1 < iVar16) {
          pMVar14 = MCInst_getOperand(MI,0);
          iVar16 = MCOperand_getImm(pMVar14);
          if (iVar16 < 4) {
            SStream_concat(&local_238,pcVar21,"dzf");
            bVar9 = true;
          }
        }
      }
    }
    uVar11 = MCInst_getNumOperands(MI);
    if (uVar11 == 3) {
      pMVar14 = MCInst_getOperand(MI,0);
      _Var10 = MCOperand_isImm(pMVar14);
      if (_Var10) {
        pMVar14 = MCInst_getOperand(MI,0);
        iVar16 = MCOperand_getImm(pMVar14);
        if (3 < iVar16) {
          pMVar14 = MCInst_getOperand(MI,0);
          iVar16 = MCOperand_getImm(pMVar14);
          if (iVar16 < 8) {
            pMVar14 = MCInst_getOperand(MI,1);
            _Var10 = MCOperand_isReg(pMVar14);
            if (_Var10) {
              pMVar18 = MCRegisterInfo_getRegClass((MCRegisterInfo *)Info,3);
              pMVar14 = MCInst_getOperand(MI,1);
              uVar11 = MCOperand_getReg(pMVar14);
              _Var10 = MCRegisterClass_contains(pMVar18,uVar11);
              if (_Var10) {
                pMVar14 = MCInst_getOperand(MI,1);
                uVar11 = MCOperand_getReg(pMVar14);
                uVar11 = (int)(uVar11 - 0x116) >> 3;
                if (uVar11 < 4) {
                  SStream_concat(&local_238,pcVar21,
                                 &DAT_003fc1ec + *(int *)(&DAT_003fc1ec + (ulong)uVar11 * 4));
                }
                bVar9 = false;
                pMVar14 = MCInst_getOperand(MI,0);
                iVar16 = MCOperand_getImm(pMVar14);
                if (iVar16 == 6) {
                  SStream_concat0(&local_238,"-");
                }
                pMVar14 = MCInst_getOperand(MI,0);
                iVar16 = MCOperand_getImm(pMVar14);
                if (iVar16 == 7) {
                  SStream_concat0(&local_238,"+");
                }
              }
            }
          }
        }
      }
    }
    uVar11 = MCInst_getNumOperands(MI);
    if (uVar11 == 3) {
      pMVar14 = MCInst_getOperand(MI,0);
      _Var10 = MCOperand_isImm(pMVar14);
      if (_Var10) {
        pMVar14 = MCInst_getOperand(MI,0);
        iVar16 = MCOperand_getImm(pMVar14);
        if (7 < iVar16) {
          pMVar14 = MCInst_getOperand(MI,0);
          iVar16 = MCOperand_getImm(pMVar14);
          if (iVar16 < 10) {
            SStream_concat(&local_238,pcVar21,"dnzt");
            bVar9 = true;
          }
        }
      }
    }
    uVar11 = MCInst_getNumOperands(MI);
    if (uVar11 == 3) {
      pMVar14 = MCInst_getOperand(MI,0);
      _Var10 = MCOperand_isImm(pMVar14);
      if (_Var10) {
        pMVar14 = MCInst_getOperand(MI,0);
        iVar16 = MCOperand_getImm(pMVar14);
        if (9 < iVar16) {
          pMVar14 = MCInst_getOperand(MI,0);
          iVar16 = MCOperand_getImm(pMVar14);
          if (iVar16 < 0xc) {
            SStream_concat(&local_238,pcVar21,"dzt");
            bVar9 = true;
          }
        }
      }
    }
    uVar11 = MCInst_getNumOperands(MI);
    if (uVar11 == 3) {
      pMVar14 = MCInst_getOperand(MI,0);
      _Var10 = MCOperand_isImm(pMVar14);
      if (_Var10) {
        pMVar14 = MCInst_getOperand(MI,0);
        iVar16 = MCOperand_getImm(pMVar14);
        if (0xb < iVar16) {
          pMVar14 = MCInst_getOperand(MI,0);
          iVar16 = MCOperand_getImm(pMVar14);
          if (iVar16 < 0x10) {
            pMVar14 = MCInst_getOperand(MI,1);
            _Var10 = MCOperand_isReg(pMVar14);
            if (_Var10) {
              pMVar18 = MCRegisterInfo_getRegClass((MCRegisterInfo *)Info,3);
              pMVar14 = MCInst_getOperand(MI,1);
              uVar11 = MCOperand_getReg(pMVar14);
              _Var10 = MCRegisterClass_contains(pMVar18,uVar11);
              if (_Var10) {
                pMVar14 = MCInst_getOperand(MI,1);
                uVar11 = MCOperand_getReg(pMVar14);
                uVar11 = (int)(uVar11 - 0x116) >> 3;
                if (uVar11 < 4) {
                  SStream_concat(&local_238,pcVar21,
                                 &DAT_003fc1fc + *(int *)(&DAT_003fc1fc + (ulong)uVar11 * 4));
                }
                bVar9 = false;
                pMVar14 = MCInst_getOperand(MI,0);
                iVar16 = MCOperand_getImm(pMVar14);
                if (iVar16 == 0xe) {
                  SStream_concat0(&local_238,"-");
                }
                pMVar14 = MCInst_getOperand(MI,0);
                iVar16 = MCOperand_getImm(pMVar14);
                if (iVar16 == 0xf) {
                  SStream_concat0(&local_238,"+");
                }
              }
            }
          }
        }
      }
    }
    uVar11 = MCInst_getNumOperands(MI);
    if (uVar11 == 3) {
      pMVar14 = MCInst_getOperand(MI,0);
      _Var10 = MCOperand_isImm(pMVar14);
      if (_Var10) {
        pMVar14 = MCInst_getOperand(MI,0);
        iVar16 = MCOperand_getImm(pMVar14);
        if (((uint)iVar16 & 0x12) == 0x10) {
          SStream_concat(&local_238,pcVar21,"dnz");
          pMVar14 = MCInst_getOperand(MI,0);
          iVar16 = MCOperand_getImm(pMVar14);
          if (iVar16 == 0x18) {
            SStream_concat0(&local_238,"-");
          }
          pMVar14 = MCInst_getOperand(MI,0);
          iVar16 = MCOperand_getImm(pMVar14);
          if (iVar16 == 0x19) {
            SStream_concat0(&local_238,"+");
          }
        }
      }
    }
    uVar11 = MCInst_getNumOperands(MI);
    if (uVar11 == 3) {
      pMVar14 = MCInst_getOperand(MI,0);
      _Var10 = MCOperand_isImm(pMVar14);
      if (_Var10) {
        pMVar14 = MCInst_getOperand(MI,0);
        iVar16 = MCOperand_getImm(pMVar14);
        if ((~(uint)iVar16 & 0x12) == 0) {
          SStream_concat(&local_238,pcVar21,"dz");
          pMVar14 = MCInst_getOperand(MI,0);
          iVar16 = MCOperand_getImm(pMVar14);
          if (iVar16 == 0x1a) {
            SStream_concat0(&local_238,"-");
          }
          pMVar14 = MCInst_getOperand(MI,0);
          iVar16 = MCOperand_getImm(pMVar14);
          if (iVar16 == 0x1b) {
            SStream_concat0(&local_238,"+");
          }
        }
      }
    }
    pMVar14 = MCInst_getOperand(MI,1);
    _Var10 = MCOperand_isReg(pMVar14);
    bVar8 = true;
    if (_Var10) {
      pMVar18 = MCRegisterInfo_getRegClass((MCRegisterInfo *)Info,3);
      pMVar14 = MCInst_getOperand(MI,1);
      uVar11 = MCOperand_getReg(pMVar14);
      _Var10 = MCRegisterClass_contains(pMVar18,uVar11);
      if (!_Var10) goto LAB_00221f79;
      pMVar14 = MCInst_getOperand(MI,0);
      _Var10 = MCOperand_isImm(pMVar14);
      if (!_Var10) goto LAB_00221f79;
      pMVar14 = MCInst_getOperand(MI,0);
      iVar16 = MCOperand_getImm(pMVar14);
      if (0xf < iVar16) goto LAB_00221f79;
      pMVar14 = MCInst_getOperand(MI,1);
      uVar11 = MCOperand_getReg(pMVar14);
      uVar11 = uVar11 + 2 & 7;
      if (!bVar9) {
        if (uVar11 != 0) {
          bVar8 = false;
          SStream_concat(&local_238," cr%d",(ulong)uVar11);
          op_addReg(MI,uVar11 + 2);
        }
        goto LAB_00221f79;
      }
      SStream_concat0(&local_238," ");
      if (uVar11 != 0) {
        SStream_concat(&local_238,"4*cr%d+",(ulong)uVar11);
      }
      pMVar14 = MCInst_getOperand(MI,1);
      uVar11 = MCOperand_getReg(pMVar14);
      switch((int)(uVar11 - 0x116) >> 3) {
      case 0:
        SStream_concat0(&local_238,"eq");
        pcVar20 = MI->csh;
        aVar13 = 0x4c;
        break;
      case 1:
        SStream_concat0(&local_238,"gt");
        pcVar20 = MI->csh;
        aVar13 = 0x2c;
        break;
      case 2:
        SStream_concat0(&local_238,"lt");
        pcVar20 = MI->csh;
        aVar13 = ARM64_CC_LT;
        break;
      case 3:
        SStream_concat0(&local_238,"so");
        pcVar20 = MI->csh;
        aVar13 = 0x8c;
        break;
      default:
        goto switchD_00221dd0_default;
      }
      if (pcVar20->detail != CS_OPT_OFF) {
        (MI->flat_insn->detail->field_6).arm64.cc = aVar13;
      }
switchD_00221dd0_default:
      pMVar14 = MCInst_getOperand(MI,1);
      uVar11 = MCOperand_getReg(pMVar14);
      uVar11 = uVar11 + 2 & 7;
      if ((uVar11 != 0) && (MI->csh->detail != CS_OPT_OFF)) {
        pcVar7 = MI->flat_insn->detail;
        puVar3 = pcVar7->groups + (ulong)(pcVar7->field_6).x86.addr_size * 0x18 + 0x1d;
        puVar3[0] = '@';
        puVar3[1] = '\0';
        puVar3[2] = '\0';
        puVar3[3] = '\0';
        pcVar7 = MI->flat_insn->detail;
        puVar3 = pcVar7->groups + (ulong)(pcVar7->field_6).x86.addr_size * 0x18 + 0x25;
        puVar3[0] = '\x04';
        puVar3[1] = '\0';
        puVar3[2] = '\0';
        puVar3[3] = '\0';
        pcVar7 = MI->flat_insn->detail;
        *(uint *)(pcVar7->groups + (ulong)(pcVar7->field_6).x86.addr_size * 0x18 + 0x29) =
             uVar11 + 2;
        pcVar7 = MI->flat_insn->detail;
        *(undefined4 *)(pcVar7->groups + (ulong)(pcVar7->field_6).x86.addr_size * 0x18 + 0x2d) =
             *(undefined4 *)(pcVar7->field_6).x86.prefix;
        puVar3 = &(MI->flat_insn->detail->field_6).x86.addr_size;
        *puVar3 = *puVar3 + '\x01';
      }
      bVar8 = false;
    }
LAB_00221f79:
    pMVar14 = MCInst_getOperand(MI,2);
    _Var10 = MCOperand_isImm(pMVar14);
    if (_Var10) {
      pMVar14 = MCInst_getOperand(MI,2);
      iVar16 = MCOperand_getImm(pMVar14);
      if (iVar16 != 0) {
        if (!bVar8) {
          SStream_concat0(&local_238,",");
        }
        SStream_concat0(&local_238,anon_var_dwarf_3a9b6b + 4);
      }
    }
    pcVar21 = cs_strdup(local_238.buffer);
    for (pcVar22 = pcVar21; cVar5 = *pcVar22, cVar5 != '\0'; pcVar22 = pcVar22 + 1) {
      if ((cVar5 == ' ') || (cVar5 == '\t')) {
        *pcVar22 = '\0';
        pcVar22 = pcVar22 + 1;
        break;
      }
    }
    SStream_concat0(O,pcVar21);
    if (*pcVar22 != '\0') {
      SStream_concat0(O,anon_var_dwarf_359a65 + 0x11);
      do {
        cVar5 = *pcVar22;
        if (cVar5 == '$') {
          pcVar1 = pcVar22 + 1;
          if (*pcVar1 == -1) {
            pcVar1 = pcVar22 + 2;
            pcVar2 = pcVar22 + 3;
            pcVar22 = pcVar22 + 3;
            printCustomAliasOperand(MI,(int)*pcVar1 - 1,(int)*pcVar2 - 1,O);
          }
          else {
            pcVar22 = pcVar22 + 1;
            printOperand(MI,(int)*pcVar1 - 1,O);
          }
        }
        else {
          if (cVar5 == '\0') break;
          SStream_concat(O,"%c",(ulong)(uint)(int)cVar5);
        }
        pcVar22 = pcVar22 + 1;
      } while( true );
    }
  }
  if (pcVar21 == (char *)0x0) {
    pcVar21 = printAliasInstr(MI,O,Info);
  }
  if (pcVar21 != (char *)0x0) {
    if (*pcVar21 != '\0') {
      sVar19 = strlen(pcVar21);
      if (((ulong)(byte)pcVar21[sVar19 - 1] < 0x2f) &&
         ((0x680000000000U >> ((ulong)(byte)pcVar21[sVar19 - 1] & 0x3f) & 1) != 0)) {
        pcVar21[sVar19 - 1] = '\0';
      }
      _Var10 = PPC_alias_insn(pcVar21,(ppc_alias *)&local_238);
      if ((_Var10) &&
         (MCInst_setOpcodePub(MI,local_238.buffer._0_4_), MI->csh->detail != CS_OPT_OFF)) {
        *(undefined4 *)(MI->flat_insn->detail->field_6).x86.prefix = local_238.buffer._4_4_;
      }
    }
    (*cs_mem_free)(pcVar21);
    return;
  }
  uVar12 = MCInst_getOpcode(MI);
  uVar11 = *(uint *)(printInstruction_OpInfo + (ulong)uVar12 * 4);
  uVar6 = *(ushort *)(printInstruction_OpInfo2 + (ulong)uVar12 * 2);
  SStream_concat0(O,&UNK_003f973f + (uVar11 & 0x3fff));
  uVar12 = (uint)O;
  switch(uVar11 >> 0xe & 0xf) {
  case 1:
    OpNo = 0;
    goto LAB_00222211;
  case 2:
    printU16ImmOperand(MI,0,O);
    break;
  case 3:
    printBranchOperand(MI,0,O);
    break;
  case 4:
    printAbsBranchOperand(MI,0,O);
    break;
  case 5:
    printPredicateOperand
              (MI,uVar12,(SStream *)0x343fcf,(char *)&switchD_00222195::switchdataD_003f69a0);
    break;
  case 6:
    uVar11 = 0;
    goto LAB_0022226c;
  case 7:
    set_mem_access(MI,true);
    SStream_concat0(O,"(");
    printOperand(MI,1,O);
    SStream_concat0(O,")");
    if (MI->csh->detail == CS_OPT_ON) {
      MI->csh->doing_mem = false;
      puVar3 = &(MI->flat_insn->detail->field_6).x86.addr_size;
      *puVar3 = *puVar3 + '\x01';
    }
    break;
  case 8:
    uVar11 = 0;
    goto LAB_002222ff;
  case 9:
    printU5ImmOperand(MI,0,O);
    break;
  case 10:
    OpNo = 1;
LAB_00222211:
    printOperand(MI,OpNo,O);
    break;
  case 0xb:
    printU4ImmOperand(MI,0,O);
    SStream_concat0(O,", ");
    uVar11 = 1;
    goto LAB_002222ff;
  case 0xc:
    printcrbitm(MI,0,O);
    SStream_concat0(O,", ");
    goto LAB_00222386;
  case 0xd:
    printU4ImmOperand(MI,1,O);
    SStream_concat0(O,", ");
    goto LAB_002223df;
  default:
    goto switchD_00222195_default;
  }
  Modifier = &switchD_00222340::switchdataD_003f69d4;
  switch(uVar11 >> 0x12 & 0x1f) {
  case 1:
    goto switchD_00222195_default;
  case 2:
    pcVar21 = " ";
    goto LAB_0022245b;
  case 4:
    pcVar21 = "a";
    goto LAB_0022251f;
  case 5:
    pcVar21 = "ctr";
    break;
  case 6:
    pcVar21 = "ctrl";
    break;
  case 7:
    SStream_concat0(O,"l");
  case 3:
    printPredicateOperand(MI,uVar12,(SStream *)0x5886fd,(char *)Modifier);
    SStream_concat0(O," ");
    printPredicateOperand(MI,uVar12,(SStream *)0x5894b2,(char *)Modifier);
    SStream_concat0(O,", ");
    goto switchD_00222830_caseD_8;
  case 8:
    pcVar21 = "la";
LAB_0022251f:
    SStream_concat0(O,pcVar21);
    printPredicateOperand(MI,uVar12,(SStream *)0x5886fd,(char *)Modifier);
    SStream_concat0(O," ");
    printPredicateOperand(MI,uVar12,(SStream *)0x5894b2,(char *)Modifier);
    SStream_concat0(O,", ");
    goto switchD_00222830_caseD_9;
  case 9:
    pcVar21 = "lr";
    break;
  case 10:
    pcVar21 = "lrl";
    break;
  case 0xb:
    goto switchD_00222340_caseD_b;
  case 0xc:
    pcVar21 = "\n\tnop";
    goto LAB_00222753;
  case 0xd:
    SStream_concat0(O,", 268");
    v = 0x10c;
    goto LAB_002224be;
  case 0xe:
    SStream_concat0(O,", 256");
    v = 0x100;
    goto LAB_002224be;
  case 0xf:
    SStream_concat0(O,", 0, ");
    op_addImm(MI,0);
    goto LAB_00222386;
  case 0x10:
    SStream_concat0(O,",");
    goto switchD_00222830_caseD_5;
  case 0x11:
    SStream_concat0(O,", -1");
    v = -1;
LAB_002224be:
    op_addImm(MI,v);
    return;
  default:
    pcVar21 = ", ";
LAB_0022245b:
    SStream_concat0(O,pcVar21);
    switch(uVar11 >> 0x17 & 0x1f) {
    case 1:
      uVar11 = 1;
      goto LAB_00222491;
    case 2:
      printMemRegReg(MI,1,O);
      goto LAB_002226f1;
    case 3:
      uVar11 = 1;
      goto LAB_00222447;
    case 4:
      uVar12 = 0;
      goto LAB_002226e9;
    case 5:
      printOperand(MI,2,O);
      SStream_concat0(O,", ");
      goto LAB_002226f1;
    case 6:
      printU5ImmOperand(MI,2,O);
      SStream_concat0(O,", ");
LAB_00222386:
      uVar11 = 1;
      goto LAB_002223e4;
    case 7:
      uVar11 = 1;
      goto LAB_0022226c;
    case 8:
      printU5ImmOperand(MI,1,O);
      goto LAB_00222625;
    case 9:
      printS16ImmOperand(MI,2,O);
      SStream_concat0(O,"(");
      printOperand(MI,1,O);
      pcVar21 = ")";
      goto LAB_00222753;
    case 10:
      uVar11 = 2;
LAB_0022226c:
      printMemRegImm(MI,uVar11,O);
      break;
    case 0xb:
      uVar11 = 2;
LAB_002222ff:
      printMemRegReg(MI,uVar11,O);
      break;
    case 0xc:
      uVar11 = 1;
      goto LAB_0022259b;
    case 0xd:
      printcrbitm(MI,1,O);
      break;
    case 0xe:
      printU4ImmOperand(MI,1,O);
      break;
    case 0xf:
      uVar11 = 1;
      goto LAB_00222589;
    case 0x10:
      printS5ImmOperand(MI,uVar12,O_00);
      break;
    default:
      uVar12 = 1;
LAB_002226e9:
      printOperand(MI,uVar12,O);
LAB_002226f1:
      switch(uVar11 >> 0x1c) {
      case 1:
        goto switchD_00222195_default;
      case 2:
        SStream_concat0(O," ");
        printOperand(MI,3,O);
        SStream_concat0(O," ");
        uVar11 = 4;
        goto LAB_002223e4;
      case 3:
        uVar11 = 0;
        break;
      case 4:
        printU6ImmOperand(MI,3,O);
        SStream_concat0(O,", ");
        uVar11 = 4;
        goto LAB_002227d8;
      case 5:
        printU5ImmOperand(MI,3,O);
        SStream_concat0(O,", ");
        printU5ImmOperand(MI,4,O);
        SStream_concat0(O,", ");
        uVar11 = 5;
        break;
      case 6:
        uVar11 = 1;
        break;
      case 7:
switchD_00222340_caseD_b:
        pcVar21 = ", 0";
LAB_00222753:
        SStream_concat0(O,pcVar21);
        return;
      case 8:
        uVar11 = 3;
        goto LAB_002223e4;
      default:
        SStream_concat0(O,", ");
        switch(uVar6 & 0xf) {
        case 1:
          uVar11 = 2;
LAB_0022259b:
          printS16ImmOperand(MI,uVar11,O);
          break;
        case 2:
          uVar11 = 2;
LAB_00222491:
          printU16ImmOperand(MI,uVar11,O);
          break;
        case 3:
          printU6ImmOperand(MI,2,O);
          goto LAB_002228a5;
        case 4:
          printU5ImmOperand(MI,2,O);
          goto LAB_002228a5;
        case 5:
switchD_00222830_caseD_5:
LAB_002223df:
          uVar11 = 0;
          goto LAB_002223e4;
        case 6:
          uVar11 = 2;
          goto LAB_00222928;
        case 7:
          printOperand(MI,3,O);
LAB_00222625:
          SStream_concat0(O,", ");
          uVar11 = 2;
          goto LAB_002223e4;
        case 8:
switchD_00222830_caseD_8:
          uVar11 = 2;
LAB_00222447:
          printBranchOperand(MI,uVar11,O);
          break;
        case 9:
switchD_00222830_caseD_9:
          printAbsBranchOperand(MI,2,O);
          break;
        default:
          printOperand(MI,2,O);
LAB_002228a5:
          if ((uVar6 & 0x10) == 0) {
            return;
          }
          SStream_concat0(O,", ");
          switch(uVar6 >> 5 & 7) {
          case 1:
            printU5ImmOperand(MI,3,O);
            if ((uVar6 >> 8 & 1) == 0) {
              return;
            }
            SStream_concat0(O,", ");
            uVar11 = 4;
            goto LAB_002227fa;
          case 2:
            uVar11 = 3;
LAB_002223e4:
            printOperand(MI,uVar11,O);
            break;
          case 3:
            uVar11 = 3;
LAB_00222928:
            printU2ImmOperand(MI,uVar11,O);
            break;
          case 4:
            uVar11 = 3;
LAB_00222589:
            printU12ImmOperand(MI,uVar11,O);
            break;
          default:
            uVar11 = 3;
LAB_002227d8:
            printU6ImmOperand(MI,uVar11,O);
          }
        }
        goto switchD_00222195_default;
      }
LAB_002227fa:
      printU5ImmOperand(MI,uVar11,O);
    }
    goto switchD_00222195_default;
  }
  SStream_concat0(O,pcVar21);
  printPredicateOperand(MI,uVar12,(SStream *)0x5886fd,(char *)Modifier);
  SStream_concat0(O," ");
  printPredicateOperand(MI,uVar12,(SStream *)0x5894b2,(char *)Modifier);
switchD_00222195_default:
  return;
}

Assistant:

void PPC_printInst(MCInst *MI, SStream *O, void *Info)
{
	char *mnem;

	// Check for slwi/srwi mnemonics.
	if (MCInst_getOpcode(MI) == PPC_RLWINM) {
		unsigned char SH = (unsigned char)MCOperand_getImm(MCInst_getOperand(MI, 2));
		unsigned char MB = (unsigned char)MCOperand_getImm(MCInst_getOperand(MI, 3));
		unsigned char ME = (unsigned char)MCOperand_getImm(MCInst_getOperand(MI, 4));
		bool useSubstituteMnemonic = false;

		if (SH <= 31 && MB == 0 && ME == (31-SH)) {
			SStream_concat0(O, "slwi\t");
			MCInst_setOpcodePub(MI, PPC_INS_SLWI);
			useSubstituteMnemonic = true;
		}

		if (SH <= 31 && MB == (32-SH) && ME == 31) {
			SStream_concat0(O, "srwi\t");
			MCInst_setOpcodePub(MI, PPC_INS_SRWI);
			useSubstituteMnemonic = true;
			SH = 32-SH;
		}

		if (useSubstituteMnemonic) {
			printOperand(MI, 0, O);
			SStream_concat0(O, ", ");
			printOperand(MI, 1, O);
			if (SH > HEX_THRESHOLD)
				SStream_concat(O, ", 0x%x", (unsigned int)SH);
			else
				SStream_concat(O, ", %u", (unsigned int)SH);

			if (MI->csh->detail) {
				cs_ppc *ppc = &MI->flat_insn->detail->ppc;

				ppc->operands[ppc->op_count].type = PPC_OP_IMM;
				ppc->operands[ppc->op_count].imm = SH;
				++ppc->op_count;
			}

			return;
		}
	}

	if ((MCInst_getOpcode(MI) == PPC_OR || MCInst_getOpcode(MI) == PPC_OR8) &&
			MCOperand_getReg(MCInst_getOperand(MI, 1)) == MCOperand_getReg(MCInst_getOperand(MI, 2))) {
		SStream_concat0(O, "mr\t");
		MCInst_setOpcodePub(MI, PPC_INS_MR);
		printOperand(MI, 0, O);
		SStream_concat0(O, ", ");
		printOperand(MI, 1, O);
		return;
	}

	if (MCInst_getOpcode(MI) == PPC_RLDICR) {
		unsigned char SH = (unsigned char)MCOperand_getImm(MCInst_getOperand(MI, 2));
		unsigned char ME = (unsigned char)MCOperand_getImm(MCInst_getOperand(MI, 3));
		// rldicr RA, RS, SH, 63-SH == sldi RA, RS, SH
		if (63-SH == ME) {
			SStream_concat0(O, "sldi\t");
			MCInst_setOpcodePub(MI, PPC_INS_SLDI);
			printOperand(MI, 0, O);
			SStream_concat0(O, ", ");
			printOperand(MI, 1, O);
			if (SH > HEX_THRESHOLD)
				SStream_concat(O, ", 0x%x", (unsigned int)SH);
			else
				SStream_concat(O, ", %u", (unsigned int)SH);

			return;
		}
	}

	if ((MCInst_getOpcode(MI) == PPC_gBC)||(MCInst_getOpcode(MI) == PPC_gBCA)||
			(MCInst_getOpcode(MI) == PPC_gBCL)||(MCInst_getOpcode(MI) == PPC_gBCLA)) {
		int64_t bd = MCOperand_getImm(MCInst_getOperand(MI, 2));
		bd = SignExtend64(bd, 14);
		MCOperand_setImm(MCInst_getOperand(MI, 2),bd);
	}

	if (isBOCTRBranch(MCInst_getOpcode(MI))) {
		if (MCOperand_isImm(MCInst_getOperand(MI,0)))
		{
			int64_t bd = MCOperand_getImm(MCInst_getOperand(MI, 0));
			bd = SignExtend64(bd, 14);
			MCOperand_setImm(MCInst_getOperand(MI, 0),bd);
		}
	}

	if ((MCInst_getOpcode(MI) == PPC_B)||(MCInst_getOpcode(MI) == PPC_BA)||
			(MCInst_getOpcode(MI) == PPC_BL)||(MCInst_getOpcode(MI) == PPC_BLA)) {
		int64_t bd = MCOperand_getImm(MCInst_getOperand(MI, 0));
		bd = SignExtend64(bd, 24);
		MCOperand_setImm(MCInst_getOperand(MI, 0),bd);
	}

	// consider our own alias instructions first
	mnem = printAliasInstrEx(MI, O, Info);
	if (!mnem)
		mnem = printAliasInstr(MI, O, Info);

	if (mnem != NULL) {
		if (strlen(mnem) > 0) {
			struct ppc_alias alias;
			// check to remove the last letter of ('.', '-', '+')
			if (mnem[strlen(mnem) - 1] == '-' || mnem[strlen(mnem) - 1] == '+' || mnem[strlen(mnem) - 1] == '.')
				mnem[strlen(mnem) - 1] = '\0';

			if (PPC_alias_insn(mnem, &alias)) {
				MCInst_setOpcodePub(MI, alias.id);
				if (MI->csh->detail) {
					MI->flat_insn->detail->ppc.bc = (ppc_bc)alias.cc;
				}
			}
		}

		cs_mem_free(mnem);
	} else
		printInstruction(MI, O, NULL);
}